

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall JSON::Parser::readNumberToken(Token *__return_storage_ptr__,Parser *this)

{
  int start;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string local_68 [32];
  string local_48 [8];
  string value;
  int code;
  bool expectNumber;
  bool allowE;
  bool allowDot;
  int count;
  int chunkStart;
  Parser *this_local;
  
  start = this->pos;
  code = 0;
  bVar2 = false;
  bVar1 = false;
  bVar4 = true;
  iVar5 = getCodeAt(this,this->pos);
  if (iVar5 == 0x2d) {
    this->pos = this->pos + 1;
  }
  while (bVar3 = isValidPos(this), bVar3) {
    iVar5 = getCodeAt(this,this->pos);
    code = code + 1;
    bVar3 = isNumberChar(iVar5);
    if (bVar3) {
      if (code == 1) {
        bVar2 = true;
        bVar1 = true;
      }
      bVar4 = false;
      this->pos = this->pos + 1;
    }
    else {
      if (bVar4) break;
      if ((bVar1) && ((iVar5 == 0x45 || (iVar5 == 0x65)))) {
        bVar1 = false;
        this->pos = this->pos + 1;
        bVar4 = isValidPos(this);
        if ((bVar4) &&
           ((iVar5 = getCodeAt(this,this->pos), iVar5 == 0x2b ||
            (iVar5 = getCodeAt(this,this->pos), iVar5 == 0x2d)))) {
          this->pos = this->pos + 1;
        }
      }
      else {
        if ((!bVar2) || (iVar5 != 0x2e)) break;
        this->pos = this->pos + 1;
      }
      bVar2 = false;
      bVar4 = true;
    }
  }
  if (bVar4) {
    unexpected(this,TYPE_NUMBER,this->pos);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)&this->input);
  std::__cxx11::string::string(local_68,local_48);
  Token::Token(__return_storage_ptr__,NUMBER,(string *)local_68,start,this->pos);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readNumberToken() {
        int chunkStart = pos;
        int count = 0;
        bool allowDot = false;
        bool allowE = false;
        bool expectNumber = true;
        int code = getCodeAt(pos);

        if (code == 45) { // '-'
            pos++;
        }

        while (isValidPos()) {
            code = getCodeAt(pos);
            count++;

            if (isNumberChar(code)) {
                if (count == 1) {
                    allowDot = true;
                    allowE = true;
                }
                expectNumber = false;
                pos++;
            } else if (expectNumber) {
                break;
            } else if (allowE && (code == 69 || code == 101)) { // 'E' or 'e'
                allowE = false;
                allowDot = false;
                expectNumber = true;
                pos++;
                if (isValidPos() && (getCodeAt(pos) == 43 || getCodeAt(pos) == 45)) { // '+' or '-'
                    pos++;
                }
            } else if (allowDot && code == 46) { // '.'
                allowDot = false;
                expectNumber = true;
                pos++;
            } else {
                break;
            }
        }

        // check
        if (expectNumber) {
            unexpected(TYPE_NUMBER, pos);
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(NUMBER, value, chunkStart, pos);
    }